

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_abs<signed_char>(uint length)

{
  byte *pbVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  char *local_30;
  shared_ptr<signed_char> pv;
  
  pcVar2 = nosimd::common::malloc<signed_char>(length);
  std::__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<signed_char,void(*)(signed_char*),void>
            ((__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2> *)&local_30,pcVar2,
             nosimd::common::free<signed_char>);
  lVar3 = 0;
  uVar6 = 0;
  pcVar2 = local_30;
  if (0 < (int)length) {
    uVar6 = (ulong)length;
  }
  for (; -lVar3 != uVar6; lVar3 = lVar3 + -1) {
    *pcVar2 = (char)lVar3;
    pcVar2 = pcVar2 + 1;
  }
  nosimd::arithmetic::abs<signed_char>(local_30,local_30,length);
  uVar4 = 0;
  do {
    if (uVar6 == uVar4) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv);
      return;
    }
    pbVar1 = (byte *)(local_30 + uVar4);
    uVar4 = uVar4 + 1;
  } while (*pbVar1 < 0x81);
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar5 = "void test_abs(unsigned int) [T = signed char]";
  *(undefined4 *)(puVar5 + 1) = 0x81;
  *(uint *)((long)puVar5 + 0xc) = length;
  __cxa_throw(puVar5,&Exception::typeinfo,0);
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}